

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWArrayPrimitiveType.h
# Opt level: O0

void __thiscall
COLLADAFW::ArrayPrimitiveType<unsigned_int>::reallocMemory
          (ArrayPrimitiveType<unsigned_int> *this,size_t minCapacity)

{
  ArrayPrimitiveType<unsigned_int> *capacity;
  void *pvVar1;
  ArrayPrimitiveType<unsigned_int> *in_RSI;
  long *in_RDI;
  size_t newCapacity;
  
  if ((ArrayPrimitiveType<unsigned_int> *)in_RDI[2] < in_RSI) {
    capacity = (ArrayPrimitiveType<unsigned_int> *)(((ulong)(in_RDI[2] * 3) >> 1) + 1);
    if (capacity < in_RSI) {
      capacity = in_RSI;
    }
    in_RDI[2] = (long)capacity;
    if (*in_RDI == 0) {
      allocMemory(in_RSI,(size_t)capacity,(int)((ulong)in_RDI >> 0x20));
    }
    else {
      pvVar1 = realloc((void *)*in_RDI,in_RDI[2] << 2);
      *in_RDI = (long)pvVar1;
      if ((ulong)in_RDI[2] < (ulong)in_RDI[1]) {
        in_RDI[1] = in_RDI[2];
      }
    }
  }
  return;
}

Assistant:

void reallocMemory ( size_t minCapacity )
		{
			if ( minCapacity <= mCapacity)
				return;
			size_t newCapacity = ( mCapacity * 3 ) / 2 + 1;
			if (newCapacity < minCapacity)
				newCapacity = minCapacity;
			mCapacity = newCapacity;

			if ( mData )
			{
				mData = ( Type* ) realloc ( mData, mCapacity * sizeof ( Type ) );
				if ( mCount > mCapacity )
					mCount = mCapacity;
			}
			else
			{
				allocMemory(newCapacity, mFlags);
			}
		}